

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.h
# Opt level: O0

char * __thiscall CNscPStackEntry::GetString(CNscPStackEntry *this,size_t *pnLength)

{
  long lVar1;
  undefined8 *in_RSI;
  long in_RDI;
  NscPCodeConstantString *p;
  
  if (*(int *)(in_RDI + 0x10) != 8) {
    __assert_fail("m_nType == NscType_String",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x168,"const char *CNscPStackEntry::GetString(size_t *) const");
  }
  if (*(ulong *)(in_RDI + 0x78) < 0x20) {
    __assert_fail("m_nDataSize >= sizeof (NscPCodeConstantString)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x169,"const char *CNscPStackEntry::GetString(size_t *) const");
  }
  lVar1 = *(long *)(in_RDI + 0x70);
  if (*(int *)(lVar1 + 8) != 0x34) {
    __assert_fail("p ->nOpCode == NscPCode_Constant",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x16b,"const char *CNscPStackEntry::GetString(size_t *) const");
  }
  if (*(int *)(lVar1 + 0xc) == 8) {
    if (*(long *)(in_RDI + 0x78) == *(long *)(lVar1 + 0x10) + 0x20) {
      if (in_RSI != (undefined8 *)0x0) {
        *in_RSI = *(undefined8 *)(lVar1 + 0x10);
      }
      return (char *)(lVar1 + 0x18);
    }
    __assert_fail("m_nDataSize == sizeof (NscPCodeConstantString) + p ->nLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                  ,0x16d,"const char *CNscPStackEntry::GetString(size_t *) const");
  }
  __assert_fail("p ->nType == NscType_String",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscPStackEntry.h"
                ,0x16c,"const char *CNscPStackEntry::GetString(size_t *) const");
}

Assistant:

const char *GetString (size_t *pnLength = NULL) const
	{
		assert (m_nType == NscType_String);
		assert (m_nDataSize >= sizeof (NscPCodeConstantString));
		NscPCodeConstantString *p = (NscPCodeConstantString *) m_pauchData;
		assert (p ->nOpCode == NscPCode_Constant);
		assert (p ->nType == NscType_String);
		assert (m_nDataSize == sizeof (NscPCodeConstantString) + p ->nLength);
		if (pnLength)
			*pnLength = p ->nLength;
		return p ->szString;
	}